

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O0

void tcg_gen_mov_vec_sparc64(TCGContext_conflict8 *tcg_ctx,TCGv_vec r,TCGv_vec a)

{
  TCGv_vec a_local;
  TCGv_vec r_local;
  TCGContext_conflict8 *tcg_ctx_local;
  
  if (r != a) {
    vec_gen_op2(tcg_ctx,INDEX_op_mov_vec,0,r,a);
  }
  return;
}

Assistant:

void tcg_gen_mov_vec(TCGContext *tcg_ctx, TCGv_vec r, TCGv_vec a)
{
    if (r != a) {
        vec_gen_op2(tcg_ctx, INDEX_op_mov_vec, 0, r, a);
    }
}